

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

bool llama_state_save_file
               (llama_context *ctx,char *path_session,llama_token *tokens,size_t n_token_count)

{
  llama_context::synchronize(ctx);
  llama_context::state_save_file(ctx,path_session,tokens,n_token_count);
  return true;
}

Assistant:

bool llama_state_save_file(llama_context * ctx, const char * path_session, const llama_token * tokens, size_t n_token_count) {
    ctx->synchronize();

    try {
        return ctx->state_save_file(path_session, tokens, n_token_count);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error saving session file: %s\n", __func__, err.what());
        return false;
    }
}